

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O1

void discordpp::from_json
               (json *j,field<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>
                        *f)

{
  _Head_base<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_false>
  _Var1;
  _Head_base<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_false>
  this;
  state sVar2;
  pointer __p;
  anon_class_1_0_00000001 local_49;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
  *local_48;
  _Move_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
  local_40;
  
  if (j->m_type == null) {
    _Var1._M_head_impl =
         (f->t_)._M_t.
         super___uniq_ptr_impl<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>,_std::default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_std::default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>_>
         .
         super__Head_base<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_false>
         ._M_head_impl;
    (f->t_)._M_t.
    super___uniq_ptr_impl<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>,_std::default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_std::default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>_>
    .
    super__Head_base<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_false>
    ._M_head_impl =
         (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
          *)0x0;
    sVar2 = nulled_e;
    if (_Var1._M_head_impl !=
        (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
         *)0x0) {
      std::
      default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>
      ::operator()((default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>
                    *)f,_Var1._M_head_impl);
    }
  }
  else {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    get_impl<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>,_0>
              (&local_40,j);
    this._M_head_impl =
         (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
          *)operator_new(0x28);
    std::__detail::__variant::
    _Move_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
    ::_Move_ctor_base((_Move_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
                       *)this._M_head_impl,&local_40);
    local_48 = (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
                *)0x0;
    _Var1._M_head_impl =
         (f->t_)._M_t.
         super___uniq_ptr_impl<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>,_std::default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_std::default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>_>
         .
         super__Head_base<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_false>
         ._M_head_impl;
    (f->t_)._M_t.
    super___uniq_ptr_impl<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>,_std::default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_std::default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>_>
    .
    super__Head_base<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_false>
    ._M_head_impl = this._M_head_impl;
    if (_Var1._M_head_impl !=
        (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
         *)0x0) {
      std::
      default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>
      ::operator()((default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>
                    *)f,_Var1._M_head_impl);
    }
    if (local_48 !=
        (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
         *)0x0) {
      std::
      default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>
      ::operator()((default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>
                    *)&local_48,local_48);
    }
    local_48 = (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
                *)0x0;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_&>
      ::_S_vtable._M_arr
      [local_40.super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_bool>.
       super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_bool>._M_index].
      _M_data)(&local_49,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
                *)&local_40);
    sVar2 = present_e;
  }
  f->s_ = sVar2;
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }